

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O2

void helics::addOperations(Filter *filt,FilterTypes type,Core *param_3)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<helics::DelayFilterOperation> operation;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  shared_ptr<helics::FilterOperations> local_78;
  shared_ptr<helics::FilterOperations> local_68;
  shared_ptr<helics::FilterOperations> local_58;
  shared_ptr<helics::FilterOperations> local_48;
  shared_ptr<helics::FilterOperations> local_38;
  shared_ptr<helics::FilterOperations> local_28;
  
  switch(type) {
  case DELAY:
    std::make_shared<helics::DelayFilterOperation>();
    this = &local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_38.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_38);
    break;
  case RANDOM_DELAY:
    std::make_shared<helics::RandomDelayFilterOperation>();
    this = &local_28.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_28.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_28);
    break;
  case RANDOM_DROP:
    std::make_shared<helics::RandomDropFilterOperation>();
    this = &local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_48);
    break;
  case REROUTE:
    std::make_shared<helics::RerouteFilterOperation>();
    this = &local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_58.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_58);
    break;
  case CLONE:
    std::make_shared<helics::CloneFilterOperation>();
    this = &local_68.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_68.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_68);
    break;
  case FIREWALL:
    std::make_shared<helics::FirewallFilterOperation>();
    this = &local_78.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    local_78.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Stack_80._M_pi;
    _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Filter::setFilterOperations(filt,&local_78);
    break;
  default:
    goto switchD_001cc4b6_default;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
switchD_001cc4b6_default:
  return;
}

Assistant:

void addOperations(Filter* filt, FilterTypes type, Core* /*cptr*/)
{
    switch (type) {
        case FilterTypes::CUSTOM:
        default:
            break;
        case FilterTypes::RANDOM_DELAY: {
            auto operation = std::make_shared<RandomDelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::DELAY: {
            auto operation = std::make_shared<DelayFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::RANDOM_DROP: {
            auto operation = std::make_shared<RandomDropFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::REROUTE: {
            auto operation = std::make_shared<RerouteFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::CLONE: {
            auto operation = std::make_shared<CloneFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
        case FilterTypes::FIREWALL: {
            auto operation = std::make_shared<FirewallFilterOperation>();
            filt->setFilterOperations(std::move(operation));
        } break;
    }
}